

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void load_GL_AMD_performance_monitor(GLADloadproc load)

{
  if (GLAD_GL_AMD_performance_monitor != 0) {
    glad_glGetPerfMonitorGroupsAMD =
         (PFNGLGETPERFMONITORGROUPSAMDPROC)(*load)("glGetPerfMonitorGroupsAMD");
    glad_glGetPerfMonitorCountersAMD =
         (PFNGLGETPERFMONITORCOUNTERSAMDPROC)(*load)("glGetPerfMonitorCountersAMD");
    glad_glGetPerfMonitorGroupStringAMD =
         (PFNGLGETPERFMONITORGROUPSTRINGAMDPROC)(*load)("glGetPerfMonitorGroupStringAMD");
    glad_glGetPerfMonitorCounterStringAMD =
         (PFNGLGETPERFMONITORCOUNTERSTRINGAMDPROC)(*load)("glGetPerfMonitorCounterStringAMD");
    glad_glGetPerfMonitorCounterInfoAMD =
         (PFNGLGETPERFMONITORCOUNTERINFOAMDPROC)(*load)("glGetPerfMonitorCounterInfoAMD");
    glad_glGenPerfMonitorsAMD = (PFNGLGENPERFMONITORSAMDPROC)(*load)("glGenPerfMonitorsAMD");
    glad_glDeletePerfMonitorsAMD =
         (PFNGLDELETEPERFMONITORSAMDPROC)(*load)("glDeletePerfMonitorsAMD");
    glad_glSelectPerfMonitorCountersAMD =
         (PFNGLSELECTPERFMONITORCOUNTERSAMDPROC)(*load)("glSelectPerfMonitorCountersAMD");
    glad_glBeginPerfMonitorAMD = (PFNGLBEGINPERFMONITORAMDPROC)(*load)("glBeginPerfMonitorAMD");
    glad_glEndPerfMonitorAMD = (PFNGLENDPERFMONITORAMDPROC)(*load)("glEndPerfMonitorAMD");
    glad_glGetPerfMonitorCounterDataAMD =
         (PFNGLGETPERFMONITORCOUNTERDATAAMDPROC)(*load)("glGetPerfMonitorCounterDataAMD");
  }
  return;
}

Assistant:

static void load_GL_AMD_performance_monitor(GLADloadproc load) {
	if(!GLAD_GL_AMD_performance_monitor) return;
	glad_glGetPerfMonitorGroupsAMD = (PFNGLGETPERFMONITORGROUPSAMDPROC)load("glGetPerfMonitorGroupsAMD");
	glad_glGetPerfMonitorCountersAMD = (PFNGLGETPERFMONITORCOUNTERSAMDPROC)load("glGetPerfMonitorCountersAMD");
	glad_glGetPerfMonitorGroupStringAMD = (PFNGLGETPERFMONITORGROUPSTRINGAMDPROC)load("glGetPerfMonitorGroupStringAMD");
	glad_glGetPerfMonitorCounterStringAMD = (PFNGLGETPERFMONITORCOUNTERSTRINGAMDPROC)load("glGetPerfMonitorCounterStringAMD");
	glad_glGetPerfMonitorCounterInfoAMD = (PFNGLGETPERFMONITORCOUNTERINFOAMDPROC)load("glGetPerfMonitorCounterInfoAMD");
	glad_glGenPerfMonitorsAMD = (PFNGLGENPERFMONITORSAMDPROC)load("glGenPerfMonitorsAMD");
	glad_glDeletePerfMonitorsAMD = (PFNGLDELETEPERFMONITORSAMDPROC)load("glDeletePerfMonitorsAMD");
	glad_glSelectPerfMonitorCountersAMD = (PFNGLSELECTPERFMONITORCOUNTERSAMDPROC)load("glSelectPerfMonitorCountersAMD");
	glad_glBeginPerfMonitorAMD = (PFNGLBEGINPERFMONITORAMDPROC)load("glBeginPerfMonitorAMD");
	glad_glEndPerfMonitorAMD = (PFNGLENDPERFMONITORAMDPROC)load("glEndPerfMonitorAMD");
	glad_glGetPerfMonitorCounterDataAMD = (PFNGLGETPERFMONITORCOUNTERDATAAMDPROC)load("glGetPerfMonitorCounterDataAMD");
}